

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O1

Bac_Man_t * Bac_ManDupUserBoxes(Bac_Man_t *p)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Bac_Man_t *pBVar7;
  size_t sVar8;
  char *pcVar9;
  Abc_Nam_t *pAVar10;
  Bac_Ntk_t *pBVar11;
  int *piVar12;
  char *pcVar13;
  long lVar14;
  ulong uVar15;
  Bac_Ntk_t *pBVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  int local_54;
  Bac_Man_t *local_50;
  Vec_Int_t *local_48;
  Bac_Man_t *local_40;
  long local_38;
  
  iVar6 = p->nNtks;
  pBVar7 = (Bac_Man_t *)calloc(1,0x530);
  pcVar13 = p->pName;
  if (pcVar13 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar13);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar13);
  }
  pBVar7->pName = pcVar9;
  pcVar13 = p->pSpec;
  if (pcVar13 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar13);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar13);
  }
  pBVar7->pSpec = pcVar9;
  pAVar10 = Abc_NamRef(p->pStrs);
  pBVar7->pStrs = pAVar10;
  pAVar10 = Abc_NamStart(1000,0x18);
  pBVar7->pMods = pAVar10;
  pBVar7->iRoot = 1;
  pBVar7->nNtks = iVar6;
  lVar19 = 0xd0;
  pBVar11 = (Bac_Ntk_t *)calloc((long)iVar6 + 1U,0xd0);
  pBVar7->pNtks = pBVar11;
  if (0 < iVar6) {
    do {
      *(Bac_Man_t **)((long)&pBVar11->pDesign + lVar19) = pBVar7;
      lVar19 = lVar19 + 0xd0;
    } while (((long)iVar6 + 1U & 0xffffffff) * 0xd0 - lVar19 != 0);
  }
  uVar5 = p->nNtks;
  if (0 < (int)uVar5) {
    piVar12 = &p->pNtks[1].iCopy;
    lVar19 = 1;
    do {
      if (*piVar12 != -1) {
        __assert_fail("p->iCopy == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                      ,0xd8,"void Bac_NtkSetCopy(Bac_Ntk_t *, int)");
      }
      *piVar12 = (int)lVar19;
      lVar19 = lVar19 + 1;
      piVar12 = piVar12 + 0x34;
    } while ((ulong)uVar5 + 1 != lVar19);
  }
  iVar6 = p->nNtks;
  if (0 < iVar6) {
    lVar19 = 1;
    local_50 = pBVar7;
    local_40 = p;
    do {
      iVar6 = local_40->pNtks[lVar19].iCopy;
      if (((long)iVar6 < 1) || (local_50->nNtks < iVar6)) {
        pBVar11 = (Bac_Ntk_t *)0x0;
      }
      else {
        pBVar11 = local_50->pNtks + iVar6;
      }
      pBVar16 = local_40->pNtks + lVar19;
      local_38 = lVar19;
      if (pBVar11 == pBVar16) {
        __assert_fail("pNew != p",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                      ,0x242,"void Bac_NtkDupUserBoxes(Bac_Ntk_t *, Bac_Ntk_t *)");
      }
      iVar6 = pBVar16->NameId;
      iVar4 = (pBVar16->vInputs).nSize;
      iVar2 = (pBVar16->vOutputs).nSize;
      iVar18 = (pBVar16->vType).nSize;
      if ((long)iVar18 < 1) {
        iVar17 = 0;
      }
      else {
        lVar19 = 0;
        iVar17 = 0;
        do {
          bVar1 = (pBVar16->vType).pArray[lVar19];
          if ((char)bVar1 < '\0') {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          iVar17 = iVar17 + (uint)((bVar1 & 0x7e) == 6);
          lVar19 = lVar19 + 1;
        } while (iVar18 != lVar19);
      }
      if (pBVar11->pDesign == (Bac_Man_t *)0x0) {
        __assert_fail("pNew->pDesign != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                      ,0x218,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
      if ((pBVar11->vInputs).nSize != 0) {
        __assert_fail("Bac_NtkPiNum(pNew) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                      ,0x219,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
      if ((pBVar11->vOutputs).nSize != 0) {
        __assert_fail("Bac_NtkPoNum(pNew) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                      ,0x21a,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
      }
      pBVar11->NameId = iVar6;
      pBVar11->iCopy = -1;
      pBVar11->iBoxNtk = -1;
      pBVar11->iBoxObj = -1;
      if ((pBVar11->vInputs).nCap < iVar4) {
        piVar12 = (pBVar11->vInputs).pArray;
        if (piVar12 == (int *)0x0) {
          piVar12 = (int *)malloc((long)iVar4 << 2);
        }
        else {
          piVar12 = (int *)realloc(piVar12,(long)iVar4 << 2);
        }
        (pBVar11->vInputs).pArray = piVar12;
        if (piVar12 == (int *)0x0) goto LAB_008a19c5;
        (pBVar11->vInputs).nCap = iVar4;
      }
      if ((pBVar11->vOutputs).nCap < iVar2) {
        piVar12 = (pBVar11->vOutputs).pArray;
        if (piVar12 == (int *)0x0) {
          piVar12 = (int *)malloc((long)iVar2 << 2);
        }
        else {
          piVar12 = (int *)realloc(piVar12,(long)iVar2 << 2);
        }
        (pBVar11->vOutputs).pArray = piVar12;
        if (piVar12 == (int *)0x0) goto LAB_008a19c5;
        (pBVar11->vOutputs).nCap = iVar2;
      }
      iVar18 = (iVar17 + iVar2) * 3 + iVar18;
      sVar8 = (size_t)iVar18;
      if ((pBVar11->vType).nCap < iVar18) {
        pcVar13 = (pBVar11->vType).pArray;
        if (pcVar13 == (char *)0x0) {
          pcVar13 = (char *)malloc(sVar8);
        }
        else {
          pcVar13 = (char *)realloc(pcVar13,sVar8);
        }
        (pBVar11->vType).pArray = pcVar13;
        (pBVar11->vType).nCap = iVar18;
      }
      local_48 = &pBVar11->vFanin;
      if ((pBVar11->vFanin).nCap < iVar18) {
        piVar12 = (pBVar11->vFanin).pArray;
        if (piVar12 == (int *)0x0) {
          piVar12 = (int *)malloc(sVar8 << 2);
        }
        else {
          piVar12 = (int *)realloc(piVar12,sVar8 << 2);
        }
        (pBVar11->vFanin).pArray = piVar12;
        if (piVar12 == (int *)0x0) goto LAB_008a19c5;
        local_48->nCap = iVar18;
      }
      pAVar10 = pBVar11->pDesign->pMods;
      pcVar13 = Abc_NamStr(pBVar11->pDesign->pStrs,iVar6);
      iVar4 = Abc_NamStrFindOrAdd(pAVar10,pcVar13,&local_54);
      pBVar7 = pBVar11->pDesign;
      if (local_54 == 0) {
        iVar6 = (int)((ulong)((long)pBVar11 - (long)pBVar7->pNtks) >> 4) * -0x3b13b13b;
        if ((iVar6 < 1) || (pBVar7->nNtks < iVar6)) {
          __assert_fail("Bac_ManNtkIsOk(p->pDesign, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                        ,0xd2,"int Bac_NtkId(Bac_Ntk_t *)");
        }
        if (iVar4 != iVar6) {
          __assert_fail("NtkId == Bac_NtkId(pNew)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                        ,0x228,"void Bac_NtkAlloc(Bac_Ntk_t *, int, int, int, int)");
        }
      }
      else {
        pcVar13 = Abc_NamStr(pBVar7->pStrs,iVar6);
        printf("Network with name %s already exists.\n",pcVar13);
      }
      iVar6 = (pBVar16->vInfo).nSize;
      if ((iVar6 != 0) && (0 < iVar6)) {
        lVar19 = 0;
        do {
          Vec_IntPush(&pBVar11->vInfo,(pBVar16->vInfo).pArray[lVar19]);
          lVar19 = lVar19 + 1;
        } while (lVar19 < (pBVar16->vInfo).nSize);
      }
      iVar6 = (pBVar16->vType).nCap;
      lVar19 = (long)iVar6;
      if (lVar19 == 0) {
        __assert_fail("Bac_NtkObjNumAlloc(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                      ,0xfe,"void Bac_NtkStartCopies(Bac_Ntk_t *)");
      }
      if ((pBVar16->vCopy).nCap < iVar6) {
        piVar12 = (pBVar16->vCopy).pArray;
        if (piVar12 == (int *)0x0) {
          piVar12 = (int *)malloc(lVar19 * 4);
        }
        else {
          piVar12 = (int *)realloc(piVar12,lVar19 * 4);
        }
        (pBVar16->vCopy).pArray = piVar12;
        if (piVar12 == (int *)0x0) {
LAB_008a19c5:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pBVar16->vCopy).nCap = iVar6;
      }
      if (0 < iVar6) {
        memset((pBVar16->vCopy).pArray,0xff,lVar19 << 2);
      }
      (pBVar16->vCopy).nSize = iVar6;
      if (0 < (pBVar16->vInputs).nSize) {
        lVar19 = 0;
        do {
          Bac_ObjDup(pBVar11,pBVar16,(pBVar16->vInputs).pArray[lVar19]);
          lVar19 = lVar19 + 1;
        } while (lVar19 < (pBVar16->vInputs).nSize);
      }
      if (0 < (pBVar16->vOutputs).nSize) {
        lVar19 = 0;
        do {
          Bac_ObjDup(pBVar11,pBVar16,(pBVar16->vOutputs).pArray[lVar19]);
          lVar19 = lVar19 + 1;
        } while (lVar19 < (pBVar16->vOutputs).nSize);
      }
      uVar5 = (pBVar16->vType).nSize;
      uVar15 = (ulong)uVar5;
      if (0 < (int)uVar5) {
        lVar19 = 0;
        do {
          pcVar13 = (pBVar16->vType).pArray;
          if ((pcVar13[lVar19] & 0xfeU) == 10) {
            lVar14 = lVar19;
            do {
              if (lVar14 < 1) {
                uVar5 = 0;
                goto LAB_008a15aa;
              }
              if ((int)uVar15 < lVar19) goto LAB_008a18ec;
              lVar3 = lVar14 + -1;
              lVar14 = lVar14 + -1;
            } while ((pcVar13[lVar3] & 0xfeU) == 6);
            uVar5 = (int)lVar14 + 1;
LAB_008a15aa:
            if (((int)uVar5 < 0) || ((pBVar16->vType).nSize <= (int)uVar5)) {
LAB_008a18ec:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                            ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
            }
            uVar15 = (ulong)uVar5;
            while (((pBVar16->vType).pArray[uVar15] & 0xfeU) == 6) {
              Bac_ObjDup(pBVar11,pBVar16,(int)uVar15);
              uVar15 = uVar15 + 1;
              if ((pBVar16->vType).nSize <= (int)uVar15) goto LAB_008a18ec;
            }
            iVar6 = (int)lVar19;
            uVar5 = Bac_ObjDup(pBVar11,pBVar16,iVar6);
            if ((((pBVar16->vName).pArray != (int *)0x0) && ((pBVar11->vName).pArray != (int *)0x0))
               && (iVar4 = Bac_ObjName(pBVar16,iVar6), iVar4 != 0)) {
              iVar6 = Bac_ObjName(pBVar16,iVar6);
              iVar4 = Bac_ObjName(pBVar11,uVar5);
              if (iVar4 != 0) {
LAB_008a19a6:
                __assert_fail("Bac_ObjName(p, i) == 0 && !Bac_ObjIsCo(p, i)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                              ,300,"void Bac_ObjSetName(Bac_Ntk_t *, int, int)");
              }
              if (((int)uVar5 < 0) || ((pBVar11->vType).nSize <= (int)uVar5)) goto LAB_008a18ec;
              if (((pBVar11->vType).pArray[uVar5] & 0xfcU) == 4) goto LAB_008a19a6;
              Vec_IntFillExtra(&pBVar11->vName,uVar5 + 1,0);
              if ((pBVar11->vName).nSize <= (int)uVar5) goto LAB_008a1987;
              (pBVar11->vName).pArray[uVar5] = iVar6;
            }
            if ((pBVar16->vType).nSize <= lVar19) goto LAB_008a18ec;
            if (((byte)(pBVar16->vType).pArray[lVar19] >> 1) - 0x49 < 0xffffffbc) {
              __assert_fail("Bac_ObjIsBox(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                            ,0x13d,"int Bac_BoxNtkId(Bac_Ntk_t *, int)");
            }
            if ((pBVar16->vFanin).nSize <= lVar19) goto LAB_008a190b;
            iVar6 = (pBVar16->vFanin).pArray[lVar19];
            if ((0 < (long)iVar6) && (iVar6 <= pBVar16->pDesign->nNtks)) {
              if (((int)uVar5 < 0) || ((pBVar11->vType).nSize <= (int)uVar5)) goto LAB_008a18ec;
              iVar6 = pBVar16->pDesign->pNtks[iVar6].iCopy;
              if (((iVar6 < 1) || (0x43 < ((byte)(pBVar11->vType).pArray[uVar5] >> 1) - 5)) ||
                 (pBVar11->pDesign->nNtks < iVar6)) {
                __assert_fail("Bac_ObjIsBox(p, i)&&Bac_ManNtkIsOk(p->pDesign, x)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                              ,0x13e,"void Bac_BoxSetNtkId(Bac_Ntk_t *, int, int)");
              }
              Vec_IntFillExtra(local_48,uVar5 + 1,0);
              if ((pBVar11->vFanin).nSize <= (int)uVar5) {
LAB_008a1987:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              (pBVar11->vFanin).pArray[uVar5] = iVar6;
            }
            lVar14 = lVar19;
            if (lVar19 + 1 < (long)(pBVar16->vType).nSize) {
              do {
                iVar6 = (int)lVar14;
                if (iVar6 < -1) goto LAB_008a18ec;
                if (((pBVar16->vType).pArray[lVar14 + 1] & 0xfeU) != 8) break;
                Bac_ObjDup(pBVar11,pBVar16,(int)(lVar14 + 1));
                lVar14 = lVar14 + 1;
              } while (iVar6 + 2 < (pBVar16->vType).nSize);
            }
          }
          lVar19 = lVar19 + 1;
          uVar15 = (ulong)(pBVar16->vType).nSize;
        } while (lVar19 < (long)uVar15);
      }
      if (0 < (pBVar16->vType).nSize) {
        lVar19 = 0;
        do {
          if (((pBVar16->vType).pArray[lVar19] & 0xfcU) == 4) {
            iVar6 = (pBVar16->vCopy).nSize;
            if (iVar6 <= lVar19) goto LAB_008a190b;
            piVar12 = (pBVar16->vCopy).pArray;
            iVar4 = piVar12[lVar19];
            if (-1 < iVar4) {
              if ((pBVar16->vFanin).nSize <= lVar19) goto LAB_008a190b;
              iVar2 = (pBVar16->vFanin).pArray[lVar19];
              if (((long)iVar2 < 0) || (iVar6 <= iVar2)) goto LAB_008a190b;
              iVar6 = piVar12[iVar2];
              if (-1 < iVar6) {
                Bac_ObjSetFanin(pBVar11,iVar4,iVar6);
              }
            }
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < (pBVar16->vType).nSize);
      }
      lVar19 = local_38 + 1;
      iVar6 = local_40->nNtks;
      pBVar7 = local_50;
      p = local_40;
    } while (local_38 < iVar6);
  }
  if (0 < iVar6) {
    pBVar11 = p->pNtks;
    lVar19 = 0;
    do {
      iVar4 = *(int *)((long)&pBVar11[1].iBoxNtk + lVar19);
      if (((long)iVar4 < 1) ||
         (lVar14 = *(long *)((long)&pBVar11[1].pDesign + lVar19), *(int *)(lVar14 + 0x24) < iVar4))
      {
        lVar14 = 0;
      }
      else {
        lVar14 = (long)iVar4 * 0xd0 + *(long *)(lVar14 + 0x28);
      }
      if (lVar14 != 0) {
        iVar4 = *(int *)((long)&pBVar11[1].iCopy + lVar19);
        if (((long)iVar4 < 1) || (pBVar7->nNtks < iVar4)) {
          pBVar16 = (Bac_Ntk_t *)0x0;
        }
        else {
          pBVar16 = pBVar7->pNtks + iVar4;
        }
        iVar4 = *(int *)((long)&pBVar11[1].iBoxObj + lVar19);
        if (((long)iVar4 < 0) || (*(int *)(lVar14 + 0xa4) <= iVar4)) {
LAB_008a190b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (pBVar16->iBoxNtk != -1) {
          __assert_fail("p->iBoxNtk == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                        ,0xee,"void Bac_NtkSetHost(Bac_Ntk_t *, int, int)");
        }
        iVar4 = *(int *)(*(long *)(lVar14 + 0xa8) + (long)iVar4 * 4);
        pBVar16->iBoxNtk = *(int *)(lVar14 + 0xc);
        pBVar16->iBoxObj = iVar4;
      }
      lVar19 = lVar19 + 0xd0;
    } while ((ulong)(iVar6 + 1) * 0xd0 + -0xd0 != lVar19);
  }
  return pBVar7;
}

Assistant:

static inline Bac_Man_t * Bac_ManDupUserBoxes( Bac_Man_t * p )
{
    Bac_Ntk_t * pNtk, * pHost; int i;
    Bac_Man_t * pNew = Bac_ManStart( p, Bac_ManNtkNum(p) );
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_NtkSetCopy( pNtk, i );
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_NtkDupUserBoxes( Bac_NtkCopyNtk(pNew, pNtk), pNtk );
    Bac_ManForEachNtk( p, pNtk, i )
        if ( (pHost = Bac_NtkHostNtk(pNtk)) )
            Bac_NtkSetHost( Bac_NtkCopyNtk(pNew, pNtk), Bac_NtkCopy(pHost), Bac_ObjCopy(pHost, Bac_NtkHostObj(pNtk)) );
    return pNew;
}